

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalMultiply
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Head_base<0UL,_duckdb::DecimalArithmeticBindData_*,_false> _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  ScalarFunction *pSVar4;
  bool bVar5;
  reference pvVar6;
  pointer pEVar7;
  pointer pDVar8;
  reference pvVar9;
  InternalException *this_02;
  OutOfRangeException *this_03;
  size_type sVar10;
  byte bVar11;
  byte params;
  LogicalTypeId LVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  uint8_t scale_1;
  uint8_t scale;
  LogicalType result_type;
  uint8_t in_stack_ffffffffffffff3d;
  uint8_t in_stack_ffffffffffffff3e;
  uint8_t local_ba;
  uint8_t local_b9;
  _Head_base<0UL,_duckdb::DecimalArithmeticBindData_*,_false> local_b8;
  _Any_data local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a0;
  LogicalType local_90;
  ScalarFunction *local_78;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  string local_50;
  
  local_78 = bound_function;
  local_70._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  local_b8._M_head_impl = (DecimalArithmeticBindData *)operator_new(0x10);
  ((local_b8._M_head_impl)->super_FunctionData)._vptr_FunctionData =
       (_func_int **)&PTR__FunctionData_01987b60;
  (local_b8._M_head_impl)->check_overflow = false;
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar11 = 0;
    params = 0;
    sVar10 = 0;
    LVar12 = INVALID;
    do {
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,sVar10);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar6);
      if ((pEVar7->return_type).id_ != UNKNOWN) {
        pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,sVar10);
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar6);
        bVar5 = LogicalType::GetDecimalProperties(&pEVar7->return_type,&local_90.id_,&local_b9);
        if (!bVar5) {
          this_02 = (InternalException *)__cxa_allocate_exception(0x10);
          local_b0._M_unused._M_object = &aStack_a0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"Could not convert type %s to a decimal?","");
          pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](arguments,sVar10);
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar6);
          LogicalType::ToString_abi_cxx11_(&local_50,&pEVar7->return_type);
          InternalException::InternalException<std::__cxx11::string>
                    (this_02,(string *)&local_b0,&local_50);
          __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (LVar12 < local_90.id_) {
          LVar12 = local_90.id_;
        }
        bVar11 = bVar11 + local_90.id_;
        params = params + local_b9;
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 < (ulong)((long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
    if (0x26 < params) {
      this_03 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_b0._M_unused._M_object = &aStack_a0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,
                 "Needed scale %d to accurately represent the multiplication result, but this is out of range of the DECIMAL type. Max scale is %d; could not perform an accurate multiplication. Either add a cast to DOUBLE, or add an explicit cast to a decimal with a lower scale."
                 ,"");
      OutOfRangeException::OutOfRangeException<unsigned_char,unsigned_char>
                (this_03,(string *)&local_b0,params,'&');
      __cxa_throw(this_03,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((params < 0x12 && LVar12 < TIMESTAMP) && 0x12 < bVar11) {
      pDVar8 = unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
               ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                             *)&local_b8);
    }
    else {
      if (bVar11 < 0x27) goto LAB_00942220;
      pDVar8 = unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
               ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                             *)&local_b8);
    }
    pDVar8->check_overflow = true;
  }
LAB_00942220:
  LogicalType::DECIMAL(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3d);
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &(local_78->super_BaseScalarFunction).super_SimpleFunction.arguments;
    sVar10 = 0;
    do {
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,sVar10);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar6);
      if ((pEVar7->return_type).physical_type_ == local_90.physical_type_) {
        pvVar9 = vector<duckdb::LogicalType,_true>::operator[](this_00,sVar10);
        if (pvVar9 != &pEVar7->return_type) {
          pvVar9->id_ = (pEVar7->return_type).id_;
          pvVar9->physical_type_ = (pEVar7->return_type).physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&pvVar9->type_info_,&(pEVar7->return_type).type_info_);
        }
      }
      else {
        bVar5 = LogicalType::GetDecimalProperties(&pEVar7->return_type,&local_b9,&local_ba);
        if (!bVar5) {
          local_ba = '\0';
        }
        LogicalType::DECIMAL(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3d);
        pvVar9 = vector<duckdb::LogicalType,_true>::operator[](this_00,sVar10);
        uVar3 = aStack_a0._M_allocated_capacity;
        uVar2 = local_b0._8_8_;
        pvVar9->id_ = local_b0._M_pod_data[0];
        pvVar9->physical_type_ = local_b0._M_pod_data[1];
        uVar13 = *(undefined4 *)
                  &(pvVar9->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar14 = *(undefined4 *)
                  ((long)&(pvVar9->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        uVar15 = *(undefined4 *)
                  &(pvVar9->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar16 = *(undefined4 *)
                  ((long)&(pvVar9->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (pvVar9->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pvVar9->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_b0._8_8_ = 0;
        aStack_a0._M_allocated_capacity = 0;
        this_01 = (pvVar9->type_info_).internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        (pvVar9->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar2;
        (pvVar9->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_68 = uVar13;
          uStack_64 = uVar14;
          uStack_60 = uVar15;
          uStack_5c = uVar16;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          uVar13 = local_68;
          uVar14 = uStack_64;
          uVar15 = uStack_60;
          uVar16 = uStack_5c;
        }
        uVar2 = aStack_a0._M_allocated_capacity;
        local_b0._12_4_ = uVar14;
        local_b0._8_4_ = uVar13;
        aStack_a0._M_allocated_capacity._4_4_ = uVar16;
        aStack_a0._M_allocated_capacity._0_4_ = uVar15;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
        LogicalType::~LogicalType((LogicalType *)&local_b0);
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 < (ulong)((long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  LogicalType::Verify(&local_90);
  pSVar4 = local_78;
  if (&(local_78->super_BaseScalarFunction).return_type != &local_90) {
    (local_78->super_BaseScalarFunction).return_type.id_ = local_90.id_;
    (local_78->super_BaseScalarFunction).return_type.physical_type_ = local_90.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(local_78->super_BaseScalarFunction).return_type.type_info_,&local_90.type_info_);
  }
  pDVar8 = unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
           ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                         *)&local_b8);
  if (pDVar8->check_overflow == true) {
    GetScalarBinaryFunction<duckdb::DecimalMultiplyOverflowCheck>
              ((scalar_function_t *)&local_b0,local_90.physical_type_);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&pSVar4->function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_b0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_a0._M_allocated_capacity !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)aStack_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
    }
  }
  else {
    GetScalarBinaryFunction<duckdb::MultiplyOperator>
              ((scalar_function_t *)&local_b0,local_90.physical_type_);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&pSVar4->function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_b0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_a0._M_allocated_capacity !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)aStack_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
    }
  }
  _Var1._M_head_impl = local_b8._M_head_impl;
  if (local_90.physical_type_ != INT128) {
    pSVar4->statistics =
         PropagateNumericStats<duckdb::TryDecimalMultiply,duckdb::MultiplyPropagateStatistics,duckdb::MultiplyOperator>
    ;
  }
  local_b8._M_head_impl = (DecimalArithmeticBindData *)0x0;
  *(DecimalArithmeticBindData **)
   local_70._M_t.
   super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
   super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = _Var1._M_head_impl;
  LogicalType::~LogicalType(&local_90);
  if (local_b8._M_head_impl != (DecimalArithmeticBindData *)0x0) {
    (*((local_b8._M_head_impl)->super_FunctionData)._vptr_FunctionData[1])();
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         local_70._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> BindDecimalMultiply(ClientContext &context, ScalarFunction &bound_function,
                                             vector<unique_ptr<Expression>> &arguments) {

	auto bind_data = make_uniq<DecimalArithmeticBindData>();

	uint8_t result_width = 0, result_scale = 0;
	uint8_t max_width = 0;
	for (idx_t i = 0; i < arguments.size(); i++) {
		if (arguments[i]->return_type.id() == LogicalTypeId::UNKNOWN) {
			continue;
		}
		uint8_t width, scale;
		auto can_convert = arguments[i]->return_type.GetDecimalProperties(width, scale);
		if (!can_convert) {
			throw InternalException("Could not convert type %s to a decimal?", arguments[i]->return_type.ToString());
		}
		if (width > max_width) {
			max_width = width;
		}
		result_width += width;
		result_scale += scale;
	}
	D_ASSERT(max_width > 0);
	if (result_scale > Decimal::MAX_WIDTH_DECIMAL) {
		throw OutOfRangeException(
		    "Needed scale %d to accurately represent the multiplication result, but this is out of range of the "
		    "DECIMAL type. Max scale is %d; could not perform an accurate multiplication. Either add a cast to DOUBLE, "
		    "or add an explicit cast to a decimal with a lower scale.",
		    result_scale, Decimal::MAX_WIDTH_DECIMAL);
	}
	if (result_width > Decimal::MAX_WIDTH_INT64 && max_width <= Decimal::MAX_WIDTH_INT64 &&
	    result_scale < Decimal::MAX_WIDTH_INT64) {
		bind_data->check_overflow = true;
		result_width = Decimal::MAX_WIDTH_INT64;
	}
	if (result_width > Decimal::MAX_WIDTH_DECIMAL) {
		bind_data->check_overflow = true;
		result_width = Decimal::MAX_WIDTH_DECIMAL;
	}
	LogicalType result_type = LogicalType::DECIMAL(result_width, result_scale);
	// since our scale is the summation of our input scales, we do not need to cast to the result scale
	// however, we might need to cast to the correct internal type
	for (idx_t i = 0; i < arguments.size(); i++) {
		auto &argument_type = arguments[i]->return_type;
		if (argument_type.InternalType() == result_type.InternalType()) {
			bound_function.arguments[i] = argument_type;
		} else {
			uint8_t width, scale;
			if (!argument_type.GetDecimalProperties(width, scale)) {
				scale = 0;
			}

			bound_function.arguments[i] = LogicalType::DECIMAL(result_width, scale);
		}
	}
	result_type.Verify();
	bound_function.return_type = result_type;
	// now select the physical function to execute
	if (bind_data->check_overflow) {
		bound_function.function = GetScalarBinaryFunction<DecimalMultiplyOverflowCheck>(result_type.InternalType());
	} else {
		bound_function.function = GetScalarBinaryFunction<MultiplyOperator>(result_type.InternalType());
	}
	if (result_type.InternalType() != PhysicalType::INT128) {
		bound_function.statistics =
		    PropagateNumericStats<TryDecimalMultiply, MultiplyPropagateStatistics, MultiplyOperator>;
	}
	return std::move(bind_data);
}